

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void C_SearchForPullins(FExecList *exec,char *file,FCommandLine *argv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  FString local_50;
  int local_48;
  FString local_38;
  FString path;
  int i;
  char *lastSlash;
  FCommandLine *argv_local;
  char *file_local;
  FExecList *exec_local;
  
  if (exec == (FExecList *)0x0) {
    __assert_fail("exec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_dispatch.cpp"
                  ,0x633,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_dispatch.cpp"
                  ,0x634,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  pcVar4 = strrchr(file,0x2f);
  path.Chars._4_4_ = 1;
  do {
    iVar1 = path.Chars._4_4_;
    iVar3 = FCommandLine::argc(argv);
    if (iVar3 <= iVar1) {
      return;
    }
    if (pcVar4 == (char *)0x0) {
LAB_0044e6a8:
      pcVar5 = FCommandLine::operator[](argv,path.Chars._4_4_);
      FString::FString(&local_50,pcVar5);
      TArray<FString,_FString>::Push(&exec->Pullins,&local_50);
      FString::~FString(&local_50);
    }
    else {
      FString::FString(&local_38,file,(size_t)(pcVar4 + (1 - (long)file)));
      pcVar5 = FCommandLine::operator[](argv,path.Chars._4_4_);
      FString::operator+=(&local_38,pcVar5);
      pcVar5 = FString::operator_cast_to_char_(&local_38);
      bVar2 = FileExists(pcVar5);
      if (bVar2) {
        TArray<FString,_FString>::Push(&exec->Pullins,&local_38);
        local_48 = 4;
      }
      else {
        local_48 = 0;
      }
      FString::~FString(&local_38);
      if (local_48 == 0) goto LAB_0044e6a8;
    }
    path.Chars._4_4_ = path.Chars._4_4_ + 1;
  } while( true );
}

Assistant:

void C_SearchForPullins(FExecList *exec, const char *file, FCommandLine &argv)
{
	const char *lastSlash;

	assert(exec != NULL);
	assert(file != NULL);
#ifdef __unix__
	lastSlash = strrchr(file, '/');
#else
	const char *lastSlash1, *lastSlash2;

	lastSlash1 = strrchr(file, '/');
	lastSlash2 = strrchr(file, '\\');
	lastSlash = MAX(lastSlash1, lastSlash2);
#endif

	for (int i = 1; i < argv.argc(); ++i)
	{
		// Try looking for the wad in the same directory as the .cfg
		// before looking for it in the current directory.
		if (lastSlash != NULL)
		{
			FString path(file, (lastSlash - file) + 1);
			path += argv[i];
			if (FileExists(path))
			{
				exec->Pullins.Push(path);
				continue;
			}
		}
		exec->Pullins.Push(argv[i]);
	}
}